

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_rgba2bgra(Mat *m,uchar *bgra,int stride)

{
  float *pfVar1;
  int *piVar2;
  int in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  int remain;
  int y;
  float *ptr3;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  int h;
  int w;
  int local_198 [3];
  int in_stack_fffffffffffffe74;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int local_180 [3];
  int local_174 [3];
  int local_168;
  int local_164;
  Mat local_160;
  float *local_118;
  Mat local_110;
  float *local_c8;
  Mat local_c0;
  float *local_78;
  Mat local_70;
  float *local_28;
  int local_20;
  int local_1c;
  int local_18;
  undefined1 *local_10;
  
  local_18 = *(int *)(in_RDI + 0x2c);
  local_1c = *(int *)(in_RDI + 0x30);
  local_20 = in_EDX + local_18 * -4;
  if (local_20 == 0) {
    local_18 = local_18 * local_1c;
    local_1c = 1;
  }
  local_10 = in_RSI;
  Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe74);
  pfVar1 = Mat::operator_cast_to_float_(&local_70);
  Mat::~Mat((Mat *)0x175a7c);
  local_28 = pfVar1;
  Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe74);
  pfVar1 = Mat::operator_cast_to_float_(&local_c0);
  Mat::~Mat((Mat *)0x175ac1);
  local_78 = pfVar1;
  Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe74);
  pfVar1 = Mat::operator_cast_to_float_(&local_110);
  Mat::~Mat((Mat *)0x175b07);
  local_c8 = pfVar1;
  Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe74);
  pfVar1 = Mat::operator_cast_to_float_(&local_160);
  Mat::~Mat((Mat *)0x175b44);
  local_118 = pfVar1;
  for (local_164 = 0; local_164 < local_1c; local_164 = local_164 + 1) {
    for (local_168 = local_18; 0 < local_168; local_168 = local_168 + -1) {
      local_174[2] = (int)*local_c8;
      local_174[1] = 0;
      piVar2 = std::max<int>(local_174 + 2,local_174 + 1);
      local_174[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_174);
      *local_10 = (char)*piVar2;
      local_180[2] = (int)*local_78;
      local_180[1] = 0;
      piVar2 = std::max<int>(local_180 + 2,local_180 + 1);
      local_180[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_180);
      local_10[1] = (char)*piVar2;
      piVar2 = std::max<int>((int *)&stack0xfffffffffffffe7c,(int *)&stack0xfffffffffffffe78);
      piVar2 = std::min<int>(piVar2,(int *)&stack0xfffffffffffffe74);
      local_10[2] = (char)*piVar2;
      local_198[2] = (int)*local_118;
      local_198[1] = 0;
      piVar2 = std::max<int>(local_198 + 2,local_198 + 1);
      local_198[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_198);
      local_10[3] = (char)*piVar2;
      local_10 = local_10 + 4;
      local_28 = local_28 + 1;
      local_78 = local_78 + 1;
      local_c8 = local_c8 + 1;
      local_118 = local_118 + 1;
    }
    local_10 = local_10 + local_20;
  }
  return;
}

Assistant:

static void to_rgba2bgra(const Mat& m, unsigned char* bgra, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w * 4;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr0 = m.channel(0);
    const float* ptr1 = m.channel(1);
    const float* ptr2 = m.channel(2);
    const float* ptr3 = m.channel(3);

    for (int y = 0; y < h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
        for (; nn > 0; nn--)
        {
            float32x4_t _rlow = vld1q_f32(ptr0);
            float32x4_t _rhigh = vld1q_f32(ptr0 + 4);
            float32x4_t _glow = vld1q_f32(ptr1);
            float32x4_t _ghigh = vld1q_f32(ptr1 + 4);
            float32x4_t _blow = vld1q_f32(ptr2);
            float32x4_t _bhigh = vld1q_f32(ptr2 + 4);
            float32x4_t _alow = vld1q_f32(ptr3);
            float32x4_t _ahigh = vld1q_f32(ptr3 + 4);

            int16x8_t _r16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_rlow)), vmovn_s32(vcvtq_s32_f32(_rhigh)));
            int16x8_t _g16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_glow)), vmovn_s32(vcvtq_s32_f32(_ghigh)));
            int16x8_t _b16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_blow)), vmovn_s32(vcvtq_s32_f32(_bhigh)));
            int16x8_t _a16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_alow)), vmovn_s32(vcvtq_s32_f32(_ahigh)));

            uint8x8x4_t _bgra;
            _bgra.val[0] = vqmovun_s16(_b16);
            _bgra.val[1] = vqmovun_s16(_g16);
            _bgra.val[2] = vqmovun_s16(_r16);
            _bgra.val[3] = vqmovun_s16(_a16);

            vst4_u8(bgra, _bgra);

            bgra += 4 * 8;
            ptr0 += 8;
            ptr1 += 8;
            ptr2 += 8;
            ptr3 += 8;
        }
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            bgra[0] = SATURATE_CAST_UCHAR(*ptr2);
            bgra[1] = SATURATE_CAST_UCHAR(*ptr1);
            bgra[2] = SATURATE_CAST_UCHAR(*ptr0);
            bgra[3] = SATURATE_CAST_UCHAR(*ptr3);

            bgra += 4;
            ptr0++;
            ptr1++;
            ptr2++;
            ptr3++;
        }

#undef SATURATE_CAST_UCHAR
        bgra += wgap;
    }
}